

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O1

void bench_wnaf_const(void *arg,int iters)

{
  int iVar1;
  uint in_register_00000004;
  int extraout_var;
  uint uVar2;
  ulong unaff_RBX;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  secp256k1_scalar *a;
  secp256k1_scalar *psVar6;
  secp256k1_scalar *unaff_R12;
  byte bVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  secp256k1_scalar *unaff_R14;
  uint64_t *unaff_R15;
  secp256k1_sha256 sStack_f8;
  ulong uStack_88;
  secp256k1_scalar *psStack_80;
  uint64_t *puStack_78;
  int iStack_6c;
  ulong uStack_68;
  secp256k1_scalar *psStack_60;
  ulong uStack_58;
  secp256k1_scalar *psStack_50;
  uint64_t *puStack_48;
  code *pcStack_40;
  uint local_34;
  
  uVar3 = (ulong)(uint)iters;
  if (iters < 1) {
    uVar5 = 0;
    uVar10 = 0;
    a = (secp256k1_scalar *)arg;
    local_34 = in_register_00000004;
  }
  else {
    unaff_R15 = (uint64_t *)((long)arg + 0x2d0);
    unaff_R12 = (secp256k1_scalar *)((long)arg + 0x20);
    uVar8 = 0;
    unaff_RBX = (ulong)(uint)iters;
    uVar5 = 0;
    local_34 = iters;
    do {
      pcStack_40 = (code *)0x11d543;
      iVar1 = secp256k1_wnaf_const((int *)unaff_R15,(secp256k1_scalar *)arg,5,0x100);
      uVar5 = (ulong)(uint)((int)uVar5 + iVar1);
      pcStack_40 = (code *)0x11d553;
      a = (secp256k1_scalar *)arg;
      iVar1 = secp256k1_scalar_add((secp256k1_scalar *)arg,(secp256k1_scalar *)arg,unaff_R12);
      uVar8 = uVar8 + iVar1;
      uVar2 = (int)unaff_RBX - 1;
      unaff_RBX = (ulong)uVar2;
    } while (uVar2 != 0);
    uVar10 = (ulong)(uVar8 >> 0x1f);
    uVar3 = (ulong)local_34;
    unaff_R14 = (secp256k1_scalar *)arg;
  }
  uVar8 = (uint)uVar5;
  if ((char)uVar10 == '\0') {
    iVar1 = (int)uVar3;
    uVar2 = iVar1 * 0x100;
    uVar3 = (ulong)uVar2;
    if (uVar8 == uVar2 || SBORROW4(uVar8,uVar2) != (int)(uVar8 + iVar1 * -0x100) < 0) {
      return;
    }
  }
  else {
    pcStack_40 = (code *)0x11d589;
    bench_wnaf_const_cold_2();
  }
  pcStack_40 = bench_ecmult_wnaf;
  bench_wnaf_const_cold_1();
  iVar1 = (int)uVar3;
  uStack_68 = unaff_RBX;
  psStack_60 = unaff_R12;
  uStack_58 = uVar10;
  psStack_50 = unaff_R14;
  puStack_48 = unaff_R15;
  pcStack_40 = (code *)uVar5;
  if (iVar1 < 1) {
    iVar4 = 0;
    bVar7 = 0;
    psVar6 = a;
    iStack_6c = extraout_var;
  }
  else {
    iVar9 = 0;
    uVar3 = uVar3 & 0xffffffff;
    iVar4 = 0;
    iStack_6c = iVar1;
    do {
      puStack_78 = (uint64_t *)0x11d5cb;
      iVar1 = secp256k1_ecmult_wnaf((int *)(a[0x16].d + 2),0x100,a,5);
      iVar4 = iVar4 + iVar1;
      puStack_78 = (uint64_t *)0x11d5db;
      psVar6 = a;
      iVar1 = secp256k1_scalar_add(a,a,a + 1);
      iVar9 = iVar9 + iVar1;
      uVar8 = (int)uVar3 - 1;
      uVar3 = (ulong)uVar8;
    } while (uVar8 != 0);
    bVar7 = (byte)((uint)iVar9 >> 0x1f);
    unaff_RBX = uVar3;
    unaff_R14 = a;
    unaff_R15 = a[0x16].d + 2;
    iVar1 = iStack_6c;
  }
  if (bVar7 == 0) {
    iVar9 = iVar1 * 0x100;
    if (iVar4 == iVar9 || SBORROW4(iVar4,iVar9) != iVar4 + iVar1 * -0x100 < 0) {
      return;
    }
  }
  else {
    puStack_78 = (uint64_t *)0x11d611;
    iVar9 = iVar1;
    bench_ecmult_wnaf_cold_2();
  }
  puStack_78 = (uint64_t *)bench_sha256;
  bench_ecmult_wnaf_cold_1();
  if (0 < iVar9) {
    uStack_88 = unaff_RBX;
    psStack_80 = unaff_R14;
    puStack_78 = unaff_R15;
    do {
      sStack_f8.s[0] = 0x6a09e667;
      sStack_f8.s[1] = 0xbb67ae85;
      sStack_f8.s[2] = 0x3c6ef372;
      sStack_f8.s[3] = 0xa54ff53a;
      sStack_f8.s[4] = 0x510e527f;
      sStack_f8.s[5] = 0x9b05688c;
      sStack_f8.s[6] = 0x1f83d9ab;
      sStack_f8.s[7] = 0x5be0cd19;
      sStack_f8.bytes = 0;
      secp256k1_sha256_write(&sStack_f8,(uchar *)(psVar6[0x14].d + 2),0x20);
      secp256k1_sha256_finalize(&sStack_f8,(uchar *)(psVar6[0x14].d + 2));
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
  return;
}

Assistant:

static void bench_wnaf_const(void* arg, int iters) {
    int i, bits = 0, overflow = 0;
    bench_inv *data = (bench_inv*)arg;

    for (i = 0; i < iters; i++) {
        bits += secp256k1_wnaf_const(data->wnaf, &data->scalar[0], WINDOW_A, 256);
        overflow += secp256k1_scalar_add(&data->scalar[0], &data->scalar[0], &data->scalar[1]);
    }
    CHECK(overflow >= 0);
    CHECK(bits <= 256*iters);
}